

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

size_t HistogramSetTotalSize(int size,int cache_bits)

{
  int iVar1;
  
  iVar1 = (4 << ((byte)cache_bits & 0x1f)) + 0x1150;
  if (cache_bits < 1) {
    iVar1 = 0x1150;
  }
  return ((long)iVar1 + 0x27) * (long)size + 0x10;
}

Assistant:

static size_t HistogramSetTotalSize(int size, int cache_bits) {
  const int histo_size = GetHistogramSize(cache_bits);
  return (sizeof(VP8LHistogramSet) + size * (sizeof(VP8LHistogram*) +
          histo_size + WEBP_ALIGN_CST));
}